

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_19::FieldIndexSorter::operator()
          (FieldIndexSorter *this,FieldDescriptor *left,FieldDescriptor *right)

{
  FieldDescriptor *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 in_EDX;
  int __c;
  int __c_00;
  undefined4 in_register_00000014;
  FieldDescriptor *in_RSI;
  FieldDescriptor *__s;
  bool local_1;
  
  this_00 = (FieldDescriptor *)CONCAT44(in_register_00000014,in_EDX);
  __s = in_RSI;
  bVar1 = FieldDescriptor::is_extension(in_RSI);
  if ((bVar1) && (bVar1 = FieldDescriptor::is_extension(this_00), bVar1)) {
    iVar2 = FieldDescriptor::number(in_RSI);
    iVar3 = FieldDescriptor::number(this_00);
    local_1 = iVar2 < iVar3;
  }
  else {
    bVar1 = FieldDescriptor::is_extension(in_RSI);
    if (bVar1) {
      local_1 = false;
    }
    else {
      bVar1 = FieldDescriptor::is_extension(this_00);
      if (bVar1) {
        local_1 = true;
      }
      else {
        pcVar4 = FieldDescriptor::index(in_RSI,(char *)__s,__c);
        pcVar5 = FieldDescriptor::index(this_00,(char *)__s,__c_00);
        local_1 = (int)pcVar4 < (int)pcVar5;
      }
    }
  }
  return local_1;
}

Assistant:

bool operator()(const FieldDescriptor* left,
                  const FieldDescriptor* right) const {
    if (left->is_extension() && right->is_extension()) {
      return left->number() < right->number();
    } else if (left->is_extension()) {
      return false;
    } else if (right->is_extension()) {
      return true;
    } else {
      return left->index() < right->index();
    }
  }